

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

int __thiscall
gl3cts::TextureSwizzle::Utils::programInfo::link(programInfo *this,char *__from,char *__to)

{
  GLuint GVar1;
  code *pcVar2;
  undefined4 uVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar8;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar9;
  TestError *this_02;
  reference local_1d0;
  MessageBuilder local_1c8;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> message;
  GLint length;
  GLint status;
  Functions *gl;
  programInfo *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext(this->m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar7 + 0x10))(this->m_program_object_id,this->m_fragment_shader_id);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0x839);
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar7 + 0x10))(this->m_program_object_id,this->m_vertex_shader_id);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0x83f);
  }
  (**(code **)(lVar7 + 0xce8))(this->m_program_object_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x844);
  (**(code **)(lVar7 + 0x9d8))
            (this->m_program_object_id,0x8b82,
             &message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x848);
  if (message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 1) {
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_38);
    (**(code **)(lVar7 + 0x9d8))
              (this->m_program_object_id,0x8b84,
               &message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"GetProgramiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0x852);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_38,
               (long)(int)message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
    uVar3 = message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    pcVar2 = *(code **)(lVar7 + 0x988);
    GVar1 = this->m_program_object_id;
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_38,0);
    (*pcVar2)(GVar1,uVar3,0,pvVar8);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"GetProgramInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0x858);
    this_00 = deqp::Context::getTestContext(this->m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [25])"Failed to link program:\n");
    local_1d0 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_38,0);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1d0);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Failed to link program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x85e);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return 1;
}

Assistant:

void Utils::programInfo::link() const
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Link status */
	glw::GLint status = GL_FALSE;

	/* Attach shaders */
	if (0 != m_fragment_shader_id)
	{
		gl.attachShader(m_program_object_id, m_fragment_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	if (0 != m_vertex_shader_id)
	{
		gl.attachShader(m_program_object_id, m_vertex_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	/* Link */
	gl.linkProgram(m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	/* Get link status */
	gl.getProgramiv(m_program_object_id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Log link error */
	if (GL_TRUE != status)
	{
		glw::GLint				 length = 0;
		std::vector<glw::GLchar> message;

		/* Get error log length */
		gl.getProgramiv(m_program_object_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(length);

		/* Get error log */
		gl.getProgramInfoLog(m_program_object_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		/* Log */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to link program:\n"
											<< &message[0] << tcu::TestLog::EndMessage;

		TCU_FAIL("Failed to link program");
	}
}